

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O0

SshChannel * ssh1_session_open(ConnectionLayer *cl,Channel *chan)

{
  ssh1_connection_state *s;
  Channel *chan_local;
  ConnectionLayer *cl_local;
  
  cl[-0xc].logctx = (LogContext *)&ssh1mainchan_vtable;
  cl[-0xc].vt = (ConnectionLayerVtable *)cl;
  cl[-0xb].logctx = (LogContext *)chan;
  queue_toplevel_callback(ssh1_session_confirm_callback,cl + -0xe);
  return (SshChannel *)(cl + -0xc);
}

Assistant:

SshChannel *ssh1_session_open(ConnectionLayer *cl, Channel *chan)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);
    s->mainchan_sc.vt = &ssh1mainchan_vtable;
    s->mainchan_sc.cl = &s->cl;
    s->mainchan_chan = chan;
    queue_toplevel_callback(ssh1_session_confirm_callback, s);
    return &s->mainchan_sc;
}